

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::TcParseFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,TcParseFunction func)

{
  Nonnull<const_char_*> pcVar1;
  AlphaNum *in_RCX;
  ulong uVar2;
  undefined8 local_70;
  char *local_68;
  AlphaNum local_40;
  
  if ((byte)this < 0x7c) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)this & 0xff,0x7c,"func_index < std::end(kNames) - std::begin(kNames)"
                       );
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    local_70 = 0x12;
    local_68 = "::_pbi::TcParser::";
    uVar2 = (ulong)(uint)((int)((ulong)this & 0xff) << 4);
    local_40.piece_._M_len = *(size_t *)((long)&TcParseFunctionName::kNames[0]._M_len + uVar2);
    local_40.piece_._M_str = *(char **)((long)&TcParseFunctionName::kNames[0]._M_str + uVar2);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_70,&local_40,in_RCX);
    return __return_storage_ptr__;
  }
  TcParseFunctionName_abi_cxx11_();
}

Assistant:

static std::string TcParseFunctionName(internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) #value,
  static constexpr absl::string_view kNames[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int func_index = static_cast<int>(func);
  ABSL_CHECK_GE(func_index, 0);
  ABSL_CHECK_LT(func_index, std::end(kNames) - std::begin(kNames));
  static constexpr absl::string_view ns = "::_pbi::TcParser::";
  return absl::StrCat(ns, kNames[func_index]);
}